

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  vec3 v;
  vec3 *uv;
  double a;
  double time;
  double in_stack_fffffffffffffea0;
  ray local_150;
  undefined1 local_118 [8];
  vec3 refracted;
  undefined1 local_c8 [8];
  vec3 reflected;
  double sin_theta;
  double local_90;
  double cos_theta;
  double local_80;
  double local_78;
  undefined1 local_70 [8];
  vec3 unit_direction;
  double local_50;
  double local_48;
  double local_40;
  double etai_over_etat;
  ray *scattered_local;
  vec3 *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  dielectric *this_local;
  
  vec3::vec3((vec3 *)(unit_direction.e + 2),1.0,1.0,1.0);
  attenuation->e[0] = unit_direction.e[2];
  attenuation->e[1] = local_50;
  attenuation->e[2] = local_48;
  if ((rec->front_face & 1U) == 0) {
    local_40 = this->ref_idx;
  }
  else {
    local_40 = 1.0 / this->ref_idx;
  }
  ray::direction((vec3 *)&cos_theta,r_in);
  v.e[1] = local_78;
  v.e[0] = local_80;
  v.e[2] = in_stack_fffffffffffffea0;
  unit_vector(v);
  vec3::operator-((vec3 *)&sin_theta,(vec3 *)local_70);
  a = dot((vec3 *)&sin_theta,&rec->normal);
  local_90 = ffmin(a,1.0);
  reflected.e[2] = sqrt(-local_90 * local_90 + 1.0);
  if (local_40 * reflected.e[2] <= 1.0) {
    uv = (vec3 *)local_70;
    refract((vec3 *)local_118,uv,&rec->normal,local_40);
    ray::time(r_in,(time_t *)uv);
    ray::ray(&local_150,&rec->p,(vec3 *)local_118,time);
    memcpy(scattered,&local_150,0x38);
  }
  else {
    reflect((vec3 *)local_c8,(vec3 *)local_70,&rec->normal);
    ray::ray((ray *)(refracted.e + 2),&rec->p,(vec3 *)local_c8,0.0);
    memcpy(scattered,refracted.e + 2,0x38);
  }
  return true;
}

Assistant:

virtual bool scatter (
            const ray& r_in,const hit_record& rec,vec3& attenuation,ray& scattered
    ) const {
        double etai_over_etat;
        attenuation = vec3(1.0, 1.0, 1.0);

        if (rec.front_face) {
            etai_over_etat = 1 / ref_idx;
        } else {
            etai_over_etat = ref_idx;
        }

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = ffmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = sqrt(1.0 - cos_theta * cos_theta);

        if (etai_over_etat * sin_theta > 1.0) {
            vec3 reflected = reflect(unit_direction, rec.normal);
            scattered = ray(rec.p, reflected);
            return true;
        }

        vec3 refracted = refract(unit_direction, rec.normal, etai_over_etat);
        scattered = ray(rec.p, refracted, r_in.time());

        return true;
    }